

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O0

record * __thiscall dml::searchRecord(dml *this,string *typeName,int32_t primaryKey)

{
  SystemCatalog *this_00;
  bool bVar1;
  _Ios_Openmode _Var2;
  uint uVar3;
  reference type_00;
  int *piVar4;
  pointer ptVar5;
  byte *pbVar6;
  size_t __nbytes;
  index iVar7;
  record *record;
  undefined1 local_380 [4];
  int offset;
  page page;
  int local_368;
  byte local_362;
  byte local_361;
  __cxx11 local_360 [6];
  uint8_t slotSize;
  uint8_t recordSize;
  string local_340 [32];
  string local_320 [55];
  allocator local_2e9;
  string local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  undefined1 local_268 [8];
  fstream searchFile;
  ulong local_58;
  uint32_t local_50;
  uint local_44;
  byte bStack_40;
  index index;
  _Self local_30;
  iterator type;
  int32_t primaryKey_local;
  string *typeName_local;
  dml *this_local;
  
  type._M_node._4_4_ = primaryKey;
  local_30._M_node = (_Base_ptr)SystemCatalog::getType(this->systemCatalog,typeName);
  index._4_8_ = std::set<type,_std::less<type>,_std::allocator<type>_>::end
                          (&this->systemCatalog->types);
  bVar1 = std::operator==(&local_30,(_Self *)&index.page_id);
  if (bVar1) {
    this_local = (dml *)0x0;
  }
  else {
    this_00 = this->systemCatalog;
    type_00 = std::_Rb_tree_const_iterator<type>::operator*(&local_30);
    iVar7 = SystemCatalog::searchKey(this_00,type_00,type._M_node._4_4_);
    local_58 = iVar7._0_8_;
    local_50 = iVar7.value;
    index.file_id = local_50;
    piVar4 = __errno_location();
    if (*piVar4 == -1) {
      this_local = (dml *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"data/",&local_2e9);
      std::__cxx11::string::string(local_340,(string *)typeName);
      truncateName(local_320);
      std::operator+(local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
      ;
      std::operator+(local_2a8,(char *)local_2c8);
      local_44 = iVar7.file_id;
      std::__cxx11::to_string(local_360,local_44);
      std::operator+(local_288,local_2a8);
      _Var2 = std::operator|(_S_in,_S_out);
      _Var2 = std::operator|(_Var2,_S_bin);
      std::fstream::fstream(local_268,(string *)local_288,_Var2);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)local_2a8);
      std::__cxx11::string::~string((string *)local_2c8);
      std::__cxx11::string::~string((string *)local_320);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      ptVar5 = std::_Rb_tree_const_iterator<type>::operator->(&local_30);
      local_361 = ptVar5->numFields * '\x04' + 1;
      local_368 = (int)(0x7fb / (ulong)(local_361 + 1));
      page.slots._4_4_ = 0xff;
      pbVar6 = (byte *)std::min<int>(&local_368,(int *)((long)&page.slots + 4));
      local_362 = *pbVar6;
      __nbytes = (size_t)local_362;
      ::page::page((page *)local_380,'\0',(uint)local_361,local_362);
      bStack_40 = iVar7.page_id;
      uVar3 = (uint)bStack_40 << 0xb | 0x16;
      ::page::read((page *)local_380,(int)local_268,(void *)(ulong)uVar3,__nbytes);
      this_local = (dml *)operator_new(0x18);
      ptVar5 = std::_Rb_tree_const_iterator<type>::operator->(&local_30);
      ::record::record((record *)this_local,'\0',ptVar5->numFields);
      uVar3 = uVar3 + local_380[2];
      ::record::read((record *)this_local,(int)local_268,
                     (void *)(ulong)(offset * (*(byte *)(page._0_8_ + (local_58 >> 0x28 & 0xff)) - 1
                                              ) + 2 + uVar3),(ulong)uVar3);
      ::page::~page((page *)local_380);
      std::fstream::~fstream(local_268);
    }
  }
  return (record *)this_local;
}

Assistant:

record* dml::searchRecord(string typeName, int32_t primaryKey) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return nullptr; }

    auto index = systemCatalog->searchKey(*type, primaryKey);

    if(errno == -1 ) {
        return nullptr ;
    }

    fstream searchFile(ROOT + truncateName(typeName) + INFIX + to_string(index.file_id), INOUTBIN);

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    page page(0, recordSize, slotSize);

    int offset = (IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE) + (index.page_id * PAGE);

    page.read(searchFile, offset);

    auto record = new class record(0, type->numFields);

    record->read(searchFile, offset + (PAGE_ID + PAGE_NUM_RECORDS) + page.slotSize + page.recordSize * (page.slots[index.record_id] - 1));

    return record;
}